

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

void __thiscall Quat4f::setAxisAngle(Quat4f *this,float radians,Vector3f *axis)

{
  int __x;
  float fVar1;
  float extraout_XMM0_Da;
  float fVar2;
  double dVar3;
  float fVar4;
  
  __x = (int)axis;
  dVar3 = cos((double)(radians * 0.5));
  this->m_elements[0] = (float)dVar3;
  dVar3 = sin((double)(radians * 0.5));
  fVar1 = (float)dVar3;
  Vector3f::abs(axis,__x);
  fVar4 = 1.0 / extraout_XMM0_Da;
  fVar2 = Vector3f::x(axis);
  this->m_elements[1] = fVar2 * fVar1 * fVar4;
  fVar2 = Vector3f::y(axis);
  this->m_elements[2] = fVar2 * fVar1 * fVar4;
  fVar2 = Vector3f::z(axis);
  this->m_elements[3] = fVar2 * fVar1 * fVar4;
  return;
}

Assistant:

void Quat4f::setAxisAngle( float radians, const Vector3f& axis )
{
	m_elements[ 0 ] = cos( radians / 2 );

	float sinHalfTheta = sin( radians / 2 );
	float vectorNorm = axis.abs();
	float reciprocalVectorNorm = 1.f / vectorNorm;

	m_elements[ 1 ] = axis.x() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 2 ] = axis.y() * sinHalfTheta * reciprocalVectorNorm;
	m_elements[ 3 ] = axis.z() * sinHalfTheta * reciprocalVectorNorm;
}